

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::ClearCase
          (ClearCase *this,Context *context,char *name,char *description,deUint32 flags)

{
  byte bVar1;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ClearCase_00a1bfe8;
  bVar1 = (byte)flags;
  this->m_scissoredClear = (bool)(bVar1 & 1);
  this->m_fullscreenScissor = (bool)(bVar1 >> 3 & 1);
  this->m_drawTriangles = (bool)(bVar1 >> 1 & 1);
  this->m_useGlobalState = (flags & 4) == 0;
  (this->m_vbo).
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)0x0;
  (this->m_perPrimitiveProgram).
  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr =
       (ShaderProgram *)0x0;
  (this->m_basicProgram).
  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr =
       (ShaderProgram *)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_objectVertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objectVertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_objectVertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ClearCase::ClearCase (Context& context, const char* name, const char* description, deUint32 flags)
	: TestCase				(context, name, description)
	, m_scissoredClear		((flags & SCISSOR_CLEAR_BIT) != 0)
	, m_fullscreenScissor	((flags & FULLSCREEN_SCISSOR_BIT) != 0)
	, m_drawTriangles		((flags & DRAW_TRIANGLE_BIT) != 0)
	, m_useGlobalState		((flags & PER_PRIMITIVE_BBOX_BIT) == 0)
{
	DE_ASSERT(m_useGlobalState || m_drawTriangles); // per-triangle bbox requires triangles
	DE_ASSERT(!m_fullscreenScissor || m_scissoredClear); // fullscreenScissor requires scissoredClear
}